

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

MinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_min(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x105) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x105;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    MinLayerParams::MinLayerParams(this_00.min_);
    (this->layer_).min_ = (MinLayerParams *)this_00;
  }
  return (MinLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::MinLayerParams* NeuralNetworkLayer::mutable_min() {
  if (!has_min()) {
    clear_layer();
    set_has_min();
    layer_.min_ = new ::CoreML::Specification::MinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.min)
  return layer_.min_;
}